

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256_32.c
# Opt level: O1

void exp_consttime_precomp
               (uint64_t *n,uint64_t mu,uint64_t *r2,uint64_t *a,uint32_t bBits,uint64_t *b,
               uint64_t *res)

{
  uint32_t i_1;
  uint uVar1;
  uint64_t uVar2;
  byte bVar3;
  sbyte sVar4;
  long lVar5;
  uint uVar6;
  uint64_t *c_00;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint64_t *ctx_r2;
  uint64_t resM [64];
  uint64_t tmp0 [64];
  uint64_t aM [64];
  uint64_t c_2 [128];
  uint64_t aM_1 [64];
  uint64_t c [128];
  uint64_t table [1024];
  uint64_t tmp [64];
  uint64_t local_3838 [64];
  uint64_t local_3638 [64];
  uint64_t local_3438 [64];
  uint64_t local_3238 [64];
  undefined1 auStack_3038 [512];
  uint64_t local_2e38 [64];
  undefined1 local_2c38 [512];
  uint64_t local_2a38 [64];
  undefined1 local_2838 [1536];
  uint64_t local_2238 [64];
  uint64_t local_2038 [64];
  uint64_t local_1e38 [64];
  uint64_t local_1c38 [64];
  uint64_t local_1a38 [64];
  uint64_t local_1838 [64];
  uint64_t local_1638 [64];
  uint64_t local_1438 [64];
  uint64_t local_1238 [64];
  ulong local_1038 [64];
  uint64_t local_e38 [64];
  ulong local_c38 [64];
  uint64_t local_a38 [64];
  ulong local_838 [64];
  uint64_t local_638 [64];
  ulong local_438 [64];
  uint64_t local_238 [65];
  
  if (bBits < 200) {
    uVar11 = 0;
    memset(local_2e38,0,0x200);
    memset(local_2a38,0,0x400);
    memset(local_2238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,a,r2,local_2238,local_2a38);
    reduction(n,mu,local_2a38,local_2e38);
    memset(local_3438,0,0x200);
    memcpy(local_3238,n,0x200);
    memcpy(auStack_3038,r2,0x200);
    memset(local_2038,0,0x200);
    memcpy(local_2238,r2,0x200);
    reduction(local_3238,mu,local_2238,local_3438);
    uVar10 = 0;
    uVar8 = uVar10;
    if (bBits != 0) {
      do {
        uVar10 = (ulong)((b[~uVar11 + bBits >> 6] >> ((ulong)(~uVar11 + bBits) & 0x3f) & 1) != 0);
        lVar5 = 0;
        do {
          uVar9 = (local_2e38[lVar5] ^ local_3438[lVar5]) & -(uVar8 ^ uVar10);
          local_3438[lVar5] = local_3438[lVar5] ^ uVar9;
          local_2e38[lVar5] = uVar9 ^ local_2e38[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x40);
        memset(local_2a38,0,0x400);
        memset(local_2238,0,0x800);
        Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64
                  (0x40,local_2e38,local_3438,local_2238,local_2a38);
        areduction(local_3238,mu,local_2a38,local_2e38);
        memset(local_2a38,0,0x400);
        memset(local_2238,0,0x800);
        Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3438,local_2238,local_2a38);
        areduction(local_3238,mu,local_2a38,local_3438);
        uVar11 = uVar11 + 1;
        uVar8 = uVar10;
      } while (uVar11 != bBits);
    }
    lVar5 = 0;
    do {
      uVar8 = (local_2e38[lVar5] ^ local_3438[lVar5]) & -uVar10;
      local_3438[lVar5] = local_3438[lVar5] ^ uVar8;
      local_2e38[lVar5] = uVar8 ^ local_2e38[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x40);
    memset(local_2038,0,0x200);
    c_00 = local_2238;
    memcpy(c_00,local_3438,0x200);
  }
  else {
    memset(local_3438,0,0x200);
    memset(local_2a38,0,0x400);
    memset(local_2238,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,a,r2,local_2238,local_2a38);
    reduction(n,mu,local_2a38,local_3438);
    memset(local_3838,0,0x200);
    uVar11 = bBits - 1 >> 6;
    memcpy(local_2e38,n,0x200);
    memcpy(local_2c38,r2,0x200);
    memset(local_2238,0,0x2000);
    memset(local_238,0,0x200);
    memset(local_2838,0,0x200);
    memcpy(local_2a38,r2,0x200);
    reduction(local_2e38,mu,local_2a38,local_2238);
    memcpy(local_2038,local_3438,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_2038,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1e38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1e38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1c38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1e38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1a38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1a38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1838,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1c38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1638,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1638,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1438,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1a38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1238,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_1238,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_1038,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1838,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_e38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_e38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_c38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1638,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_a38,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_a38,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_838,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_1438,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_638,local_238,0x200);
    memset(local_3238,0,0x400);
    memset(local_2a38,0,0x800);
    Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64(0x40,local_3438,local_638,local_2a38,local_3238);
    areduction(local_2e38,mu,local_3238,local_238);
    memcpy(local_438,local_238,0x200);
    if ((bBits & 3) == 0) {
      memset(local_2838,0,0x200);
      memcpy(local_2a38,local_2c38,0x200);
      reduction(local_2e38,mu,local_2a38,local_3838);
    }
    else {
      uVar1 = bBits >> 6;
      bVar3 = (byte)bBits & 0x3c;
      uVar6 = (uint)(b[uVar1] >> bVar3);
      if ((bBits & 0x3c) != 0 && uVar1 < uVar11) {
        uVar6 = uVar6 | (uint)(b[(ulong)uVar1 + 1] << (-bVar3 & 0x3f));
      }
      uVar8 = (ulong)(uVar6 & 0xf);
      memcpy(local_3838,local_2238,0x200);
      uVar2 = FStar_UInt64_eq_mask(uVar8,1);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_2038[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,2);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1e38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,3);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1c38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,4);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1a38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,5);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1838[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,6);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1638[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,7);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1438[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,8);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1238[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,9);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_1038[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,10);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_e38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xb);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_c38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xc);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_a38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xd);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_838[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xe);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_638[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xf);
      lVar5 = 0;
      do {
        local_3838[lVar5] = local_3838[lVar5] & ~uVar2 | local_438[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
    }
    iVar12 = 0;
    memset(local_3638,0,0x200);
    do {
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_sqr_uint64(0x40,local_3838,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      uVar6 = ((bBits & 0xfffffffc) + iVar12 * -4) - 4;
      uVar1 = uVar6 >> 6;
      uVar6 = uVar6 & 0x3c;
      sVar4 = (sbyte)uVar6;
      uVar7 = (uint)(b[uVar1] >> sVar4);
      if (uVar6 != 0 && uVar1 < uVar11) {
        uVar7 = uVar7 | (uint)(b[(ulong)uVar1 + 1] << (-sVar4 & 0x3fU));
      }
      uVar8 = (ulong)(uVar7 & 0xf);
      memcpy(local_3638,local_2238,0x200);
      uVar2 = FStar_UInt64_eq_mask(uVar8,1);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_2038[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,2);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1e38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,3);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1c38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,4);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1a38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,5);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1838[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,6);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1638[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,7);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1438[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,8);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1238[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,9);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_1038[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,10);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_e38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xb);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_c38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xc);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_a38[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xd);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_838[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xe);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_638[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      uVar2 = FStar_UInt64_eq_mask(uVar8,0xf);
      lVar5 = 0;
      do {
        local_3638[lVar5] = local_3638[lVar5] & ~uVar2 | local_438[lVar5] & uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
      memset(local_3238,0,0x400);
      memset(local_2a38,0,0x800);
      Hacl_Bignum_Karatsuba_bn_karatsuba_mul_uint64
                (0x40,local_3838,local_3638,local_2a38,local_3238);
      areduction(local_2e38,mu,local_3238,local_3838);
      iVar12 = iVar12 + 1;
    } while (iVar12 != (bBits >> 2) + (uint)(bBits == 0));
    memset(local_2838,0,0x200);
    c_00 = local_2a38;
    memcpy(c_00,local_3838,0x200);
  }
  reduction(n,mu,c_00,res);
  return;
}

Assistant:

static inline void
exp_consttime_precomp(
  uint32_t *n,
  uint32_t mu,
  uint32_t *r2,
  uint32_t *a,
  uint32_t bBits,
  uint32_t *b,
  uint32_t *res
)
{
  if (bBits < 200U)
  {
    uint32_t aM[8U] = { 0U };
    to(n, mu, r2, a, aM);
    uint32_t resM[8U] = { 0U };
    uint32_t ctx[16U] = { 0U };
    memcpy(ctx, n, 8U * sizeof (uint32_t));
    memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
    uint32_t sw = 0U;
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
    for (uint32_t i0 = 0U; i0 < bBits; i0++)
    {
      uint32_t i1 = (bBits - i0 - 1U) / 32U;
      uint32_t j = (bBits - i0 - 1U) % 32U;
      uint32_t tmp = b[i1];
      uint32_t bit = tmp >> j & 1U;
      uint32_t sw1 = bit ^ sw;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t dummy = (0U - sw1) & (resM[i] ^ aM[i]);
        resM[i] = resM[i] ^ dummy;
        aM[i] = aM[i] ^ dummy;);
      uint32_t *ctx_n0 = ctx;
      amont_mul(ctx_n0, mu, aM, resM, aM);
      uint32_t *ctx_n1 = ctx;
      amont_sqr(ctx_n1, mu, resM, resM);
      sw = bit;
    }
    uint32_t sw0 = sw;
    KRML_MAYBE_FOR8(i,
      0U,
      8U,
      1U,
      uint32_t dummy = (0U - sw0) & (resM[i] ^ aM[i]);
      resM[i] = resM[i] ^ dummy;
      aM[i] = aM[i] ^ dummy;);
    from(n, mu, resM, res);
    return;
  }
  uint32_t aM[8U] = { 0U };
  to(n, mu, r2, a, aM);
  uint32_t resM[8U] = { 0U };
  uint32_t bLen;
  if (bBits == 0U)
  {
    bLen = 1U;
  }
  else
  {
    bLen = (bBits - 1U) / 32U + 1U;
  }
  uint32_t ctx[16U] = { 0U };
  memcpy(ctx, n, 8U * sizeof (uint32_t));
  memcpy(ctx + 8U, r2, 8U * sizeof (uint32_t));
  uint32_t table[128U] = { 0U };
  uint32_t tmp[8U] = { 0U };
  uint32_t *t0 = table;
  uint32_t *t1 = table + 8U;
  uint32_t *ctx_n0 = ctx;
  uint32_t *ctx_r20 = ctx + 8U;
  from(ctx_n0, mu, ctx_r20, t0);
  memcpy(t1, aM, 8U * sizeof (uint32_t));
  KRML_MAYBE_FOR7(i,
    0U,
    7U,
    1U,
    uint32_t *t11 = table + (i + 1U) * 8U;
    uint32_t *ctx_n1 = ctx;
    amont_sqr(ctx_n1, mu, t11, tmp);
    memcpy(table + (2U * i + 2U) * 8U, tmp, 8U * sizeof (uint32_t));
    uint32_t *t2 = table + (2U * i + 2U) * 8U;
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, aM, t2, tmp);
    memcpy(table + (2U * i + 3U) * 8U, tmp, 8U * sizeof (uint32_t)););
  if (bBits % 4U != 0U)
  {
    uint32_t i0 = bBits / 4U * 4U;
    uint32_t bits_c = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, i0, 4U);
    memcpy(resM, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_c, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = resM;
        uint32_t x = (c & res_j[i]) | (~c & resM[i]);
        os[i] = x;););
  }
  else
  {
    uint32_t *ctx_n = ctx;
    uint32_t *ctx_r2 = ctx + 8U;
    from(ctx_n, mu, ctx_r2, resM);
  }
  uint32_t tmp0[8U] = { 0U };
  for (uint32_t i0 = 0U; i0 < bBits / 4U; i0++)
  {
    KRML_MAYBE_FOR4(i,
      0U,
      4U,
      1U,
      uint32_t *ctx_n = ctx;
      amont_sqr(ctx_n, mu, resM, resM););
    uint32_t k = bBits - bBits % 4U - 4U * i0 - 4U;
    uint32_t bits_l = Hacl_Bignum_Lib_bn_get_bits_u32(bLen, b, k, 4U);
    memcpy(tmp0, (uint32_t *)table, 8U * sizeof (uint32_t));
    KRML_MAYBE_FOR15(i1,
      0U,
      15U,
      1U,
      uint32_t c = FStar_UInt32_eq_mask(bits_l, i1 + 1U);
      const uint32_t *res_j = table + (i1 + 1U) * 8U;
      KRML_MAYBE_FOR8(i,
        0U,
        8U,
        1U,
        uint32_t *os = tmp0;
        uint32_t x = (c & res_j[i]) | (~c & tmp0[i]);
        os[i] = x;););
    uint32_t *ctx_n = ctx;
    amont_mul(ctx_n, mu, resM, tmp0, resM);
  }
  from(n, mu, resM, res);
}